

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void msg(char *fmt,...)

{
  char local_428 [8];
  char buf [1024];
  va_list vp;
  char *fmt_local;
  
  buf[0x3fc] = '0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  buf[0x3f8] = '\b';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  vstrnfmt(local_428,0x400,fmt,(__va_list_tag *)(buf + 0x3f8));
  if (messages != (msgqueue_t *)0x0) {
    message_add(local_428,0);
    event_signal_message(EVENT_MESSAGE,L'\0',local_428);
  }
  return;
}

Assistant:

void msg(const char *fmt, ...)
{
	va_list vp;

	char buf[1024];

	/* Begin the Varargs Stuff */
	va_start(vp, fmt);

	/* Format the args, save the length */
	(void)vstrnfmt(buf, sizeof(buf), fmt, vp);

	/* End the Varargs Stuff */
	va_end(vp);

	/* Fail if messages not loaded */
	if (!messages) return;

	/* Add to message log */
	message_add(buf, MSG_GENERIC);

	/* Send refresh event */
	event_signal_message(EVENT_MESSAGE, MSG_GENERIC, buf);

}